

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borromean_impl.h
# Opt level: O3

int secp256k1_borromean_verify
              (secp256k1_ecmult_context *ecmult_ctx,secp256k1_scalar *evalues,uchar *e0,
              secp256k1_scalar *s,secp256k1_gej *pubs,size_t *rsizes,size_t nrings,uchar *m,
              size_t mlen)

{
  size_t *psVar1;
  int iVar2;
  uint uVar3;
  size_t *extraout_RAX;
  size_t *extraout_RAX_00;
  size_t *psVar4;
  secp256k1_gej *a;
  secp256k1_scalar *ng;
  secp256k1_scalar *psVar5;
  ulong uVar6;
  size_t sVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint32_t epos;
  uint32_t ring;
  size_t size;
  secp256k1_scalar ens;
  uchar tmp [33];
  secp256k1_gej rgej;
  secp256k1_ge rge;
  uint local_298;
  uint local_294;
  int local_290;
  uint local_28c;
  uchar *local_288;
  long local_280;
  size_t *local_278;
  secp256k1_scalar *local_270;
  secp256k1_scalar *local_268;
  secp256k1_gej *local_260;
  secp256k1_ecmult_context *local_258;
  secp256k1_gej *local_250;
  secp256k1_scalar *local_248;
  size_t local_240;
  secp256k1_scalar local_238;
  uchar local_218;
  uchar uStack_217;
  uchar uStack_216;
  uchar uStack_215;
  uchar uStack_214;
  uchar uStack_213;
  uchar uStack_212;
  uchar uStack_211;
  uchar uStack_210;
  uchar uStack_20f;
  uchar uStack_20e;
  uchar uStack_20d;
  uchar uStack_20c;
  uchar uStack_20b;
  uchar uStack_20a;
  uchar uStack_209;
  uchar local_208;
  uchar uStack_207;
  uchar uStack_206;
  uchar uStack_205;
  uchar uStack_204;
  uchar uStack_203;
  uchar uStack_202;
  uchar uStack_201;
  uchar uStack_200;
  uchar uStack_1ff;
  uchar uStack_1fe;
  uchar uStack_1fd;
  uchar uStack_1fc;
  uchar uStack_1fb;
  uchar uStack_1fa;
  uchar uStack_1f9;
  secp256k1_sha256 local_1e8;
  secp256k1_sha256 local_178;
  secp256k1_gej local_108;
  secp256k1_ge local_88;
  
  local_178.s[0] = 0x6a09e667;
  local_178.s[1] = 0xbb67ae85;
  local_178.s[2] = 0x3c6ef372;
  local_178.s[3] = 0xa54ff53a;
  local_178.s[4] = 0x510e527f;
  local_178.s[5] = 0x9b05688c;
  local_178.s[6] = 0x1f83d9ab;
  local_178.s[7] = 0x5be0cd19;
  local_178.bytes = 0;
  local_278 = rsizes;
  local_270 = evalues;
  local_268 = s;
  local_260 = pubs;
  local_258 = ecmult_ctx;
  if (nrings != 0) {
    local_280 = 0;
    sVar7 = 0;
    local_288 = e0;
    do {
      local_1e8.s[0] = 0x6a09e667;
      local_1e8.s[1] = 0xbb67ae85;
      local_1e8.s[2] = 0x3c6ef372;
      local_1e8.s[3] = 0xa54ff53a;
      local_1e8.s[4] = 0x510e527f;
      local_1e8.s[5] = 0x9b05688c;
      local_1e8.s[6] = 0x1f83d9ab;
      local_1e8.s[7] = 0x5be0cd19;
      local_1e8.bytes = 0;
      uVar3 = (uint)sVar7;
      local_294 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      local_298 = 0;
      local_28c = local_294;
      secp256k1_sha256_write(&local_1e8,local_288,0x20);
      secp256k1_sha256_write(&local_1e8,m,mlen);
      secp256k1_sha256_write(&local_1e8,(uchar *)&local_294,4);
      secp256k1_sha256_write(&local_1e8,(uchar *)&local_298,4);
      secp256k1_sha256_finalize(&local_1e8,&local_218);
      secp256k1_scalar_set_b32(&local_238,&local_218,&local_290);
      psVar1 = local_278;
      if (local_278[sVar7] != 0) {
        ng = local_268 + local_280;
        a = local_260 + local_280;
        psVar5 = local_270 + local_280;
        uVar6 = 0;
        psVar4 = local_278;
        do {
          if (local_290 != 0) {
            return 0;
          }
          auVar9._0_4_ = -(uint)((int)ng->d[2] == 0 && (int)ng->d[0] == 0);
          auVar9._4_4_ = -(uint)(*(int *)((long)ng->d + 0x14) == 0 && *(int *)((long)ng->d + 4) == 0
                                );
          auVar9._8_4_ = -(uint)((int)ng->d[3] == 0 && (int)ng->d[1] == 0);
          auVar9._12_4_ =
               -(uint)(*(int *)((long)ng->d + 0x1c) == 0 && *(int *)((long)ng->d + 0xc) == 0);
          iVar2 = movmskps((int)psVar4,auVar9);
          if (iVar2 == 0xf) {
            return 0;
          }
          if ((local_238.d[3] == 0 && local_238.d[1] == 0) &&
              (local_238.d[2] == 0 && local_238.d[0] == 0)) {
            return 0;
          }
          if (a->infinity != 0) {
            return 0;
          }
          if (local_270 != (secp256k1_scalar *)0x0) {
            psVar5->d[2] = local_238.d[2];
            psVar5->d[3] = local_238.d[3];
            psVar5->d[0] = local_238.d[0];
            psVar5->d[1] = local_238.d[1];
          }
          local_250 = a;
          local_248 = psVar5;
          secp256k1_ecmult(local_258,&local_108,a,&local_238,ng);
          if (local_108.infinity != 0) {
            return 0;
          }
          secp256k1_ge_set_gej_var(&local_88,&local_108);
          secp256k1_eckey_pubkey_serialize(&local_88,&local_218,&local_240,1);
          if (uVar6 == psVar1[sVar7] - 1) {
            secp256k1_sha256_write(&local_178,&local_218,local_240);
            psVar4 = extraout_RAX;
          }
          else {
            local_1e8.s[0] = 0x6a09e667;
            local_1e8.s[1] = 0xbb67ae85;
            local_1e8.s[2] = 0x3c6ef372;
            local_1e8.s[3] = 0xa54ff53a;
            local_1e8.s[4] = 0x510e527f;
            local_1e8.s[5] = 0x9b05688c;
            local_1e8.s[6] = 0x1f83d9ab;
            local_1e8.s[7] = 0x5be0cd19;
            local_1e8.bytes = 0;
            local_294 = local_28c;
            uVar3 = (int)uVar6 + 1;
            local_298 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                        uVar3 * 0x1000000;
            secp256k1_sha256_write(&local_1e8,&local_218,0x21);
            secp256k1_sha256_write(&local_1e8,m,mlen);
            secp256k1_sha256_write(&local_1e8,(uchar *)&local_294,4);
            secp256k1_sha256_write(&local_1e8,(uchar *)&local_298,4);
            secp256k1_sha256_finalize(&local_1e8,&local_218);
            secp256k1_scalar_set_b32(&local_238,&local_218,&local_290);
            psVar4 = extraout_RAX_00;
          }
          uVar6 = uVar6 + 1;
          ng = ng + 1;
          a = local_250 + 1;
          psVar5 = local_248 + 1;
        } while (uVar6 < psVar1[sVar7]);
        local_280 = local_280 + uVar6;
      }
      sVar7 = sVar7 + 1;
      e0 = local_288;
    } while (sVar7 != nrings);
  }
  secp256k1_sha256_write(&local_178,m,mlen);
  secp256k1_sha256_finalize(&local_178,&local_218);
  auVar8[0] = -(e0[0x10] == local_208);
  auVar8[1] = -(e0[0x11] == uStack_207);
  auVar8[2] = -(e0[0x12] == uStack_206);
  auVar8[3] = -(e0[0x13] == uStack_205);
  auVar8[4] = -(e0[0x14] == uStack_204);
  auVar8[5] = -(e0[0x15] == uStack_203);
  auVar8[6] = -(e0[0x16] == uStack_202);
  auVar8[7] = -(e0[0x17] == uStack_201);
  auVar8[8] = -(e0[0x18] == uStack_200);
  auVar8[9] = -(e0[0x19] == uStack_1ff);
  auVar8[10] = -(e0[0x1a] == uStack_1fe);
  auVar8[0xb] = -(e0[0x1b] == uStack_1fd);
  auVar8[0xc] = -(e0[0x1c] == uStack_1fc);
  auVar8[0xd] = -(e0[0x1d] == uStack_1fb);
  auVar8[0xe] = -(e0[0x1e] == uStack_1fa);
  auVar8[0xf] = -(e0[0x1f] == uStack_1f9);
  auVar10[0] = -(*e0 == local_218);
  auVar10[1] = -(e0[1] == uStack_217);
  auVar10[2] = -(e0[2] == uStack_216);
  auVar10[3] = -(e0[3] == uStack_215);
  auVar10[4] = -(e0[4] == uStack_214);
  auVar10[5] = -(e0[5] == uStack_213);
  auVar10[6] = -(e0[6] == uStack_212);
  auVar10[7] = -(e0[7] == uStack_211);
  auVar10[8] = -(e0[8] == uStack_210);
  auVar10[9] = -(e0[9] == uStack_20f);
  auVar10[10] = -(e0[10] == uStack_20e);
  auVar10[0xb] = -(e0[0xb] == uStack_20d);
  auVar10[0xc] = -(e0[0xc] == uStack_20c);
  auVar10[0xd] = -(e0[0xd] == uStack_20b);
  auVar10[0xe] = -(e0[0xe] == uStack_20a);
  auVar10[0xf] = -(e0[0xf] == uStack_209);
  auVar10 = auVar10 & auVar8;
  return (uint)((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) == 0xffff);
}

Assistant:

int secp256k1_borromean_verify(const secp256k1_ecmult_context* ecmult_ctx, secp256k1_scalar *evalues, const unsigned char *e0,
 const secp256k1_scalar *s, const secp256k1_gej *pubs, const size_t *rsizes, size_t nrings, const unsigned char *m, size_t mlen) {
    secp256k1_gej rgej;
    secp256k1_ge rge;
    secp256k1_scalar ens;
    secp256k1_sha256 sha256_e0;
    unsigned char tmp[33];
    size_t i;
    size_t j;
    size_t count;
    size_t size;
    int overflow;
    VERIFY_CHECK(ecmult_ctx != NULL);
    VERIFY_CHECK(e0 != NULL);
    VERIFY_CHECK(s != NULL);
    VERIFY_CHECK(pubs != NULL);
    VERIFY_CHECK(rsizes != NULL);
    VERIFY_CHECK(nrings > 0);
    VERIFY_CHECK(m != NULL);
    count = 0;
    secp256k1_sha256_initialize(&sha256_e0);
    for (i = 0; i < nrings; i++) {
        VERIFY_CHECK(INT_MAX - count > rsizes[i]);
        secp256k1_borromean_hash(tmp, m, mlen, e0, 32, i, 0);
        secp256k1_scalar_set_b32(&ens, tmp, &overflow);
        for (j = 0; j < rsizes[i]; j++) {
            if (overflow || secp256k1_scalar_is_zero(&s[count]) || secp256k1_scalar_is_zero(&ens) || secp256k1_gej_is_infinity(&pubs[count])) {
                return 0;
            }
            if (evalues) {
                /*If requested, save the challenges for proof rewind.*/
                evalues[count] = ens;
            }
            secp256k1_ecmult(ecmult_ctx, &rgej, &pubs[count], &ens, &s[count]);
            if (secp256k1_gej_is_infinity(&rgej)) {
                return 0;
            }
            /* OPT: loop can be hoisted and split to use batch inversion across all the rings; this would make it much faster. */
            secp256k1_ge_set_gej_var(&rge, &rgej);
            secp256k1_eckey_pubkey_serialize(&rge, tmp, &size, 1);
            if (j != rsizes[i] - 1) {
                secp256k1_borromean_hash(tmp, m, mlen, tmp, 33, i, j + 1);
                secp256k1_scalar_set_b32(&ens, tmp, &overflow);
            } else {
                secp256k1_sha256_write(&sha256_e0, tmp, size);
            }
            count++;
        }
    }
    secp256k1_sha256_write(&sha256_e0, m, mlen);
    secp256k1_sha256_finalize(&sha256_e0, tmp);
    return memcmp(e0, tmp, 32) == 0;
}